

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void auxsetstr(lua_State *L,TValue *t,char *k)

{
  long lVar1;
  StkId pSVar2;
  TString *key;
  TString *x_;
  TValue *io;
  TValue *io2;
  TValue *io1;
  TString *str;
  TValue *slot;
  char *k_local;
  TValue *t_local;
  lua_State *L_local;
  
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    str = (TString *)luaH_getstr((Table *)(t->value_).gc,key);
    if ((str->tt & 0xf) != 0) {
      lVar1 = (L->top).offset;
      *(Value *)&str->next = *(Value *)(lVar1 + -0x10);
      str->tt = *(lu_byte *)(lVar1 + -8);
      if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
          ((((t->value_).gc)->marked & 0x20) != 0)) &&
         ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
        luaC_barrierback_(L,(t->value_).gc);
      }
      (L->top).p = (StkId)((L->top).offset + -0x10);
      return;
    }
  }
  else {
    str = (TString *)0x0;
  }
  pSVar2 = (L->top).p;
  *(TString **)pSVar2 = key;
  (pSVar2->val).tt_ = key->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  luaV_finishset(L,t,(TValue *)((L->top).offset + -0x10),(TValue *)((L->top).offset + -0x20),
                 (TValue *)str);
  (L->top).p = (StkId)((L->top).offset + -0x20);
  return;
}

Assistant:

static void auxsetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  api_checknelems(L, 1);
  if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
    luaV_finishfastset(L, t, slot, s2v(L->top.p - 1));
    L->top.p--;  /* pop value */
  }
  else {
    setsvalue2s(L, L->top.p, str);  /* push 'str' (to make it a TValue) */
    api_incr_top(L);
    luaV_finishset(L, t, s2v(L->top.p - 1), s2v(L->top.p - 2), slot);
    L->top.p -= 2;  /* pop value and key */
  }
  lua_unlock(L);  /* lock done by caller */
}